

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

char * lj_buf_tmp(lua_State *L,MSize sz)

{
  ulong uVar1;
  uint in_ESI;
  long in_RDI;
  SBuf *sb;
  MSize in_stack_ffffffffffffffcc;
  undefined8 local_8;
  
  uVar1 = (ulong)*(uint *)(in_RDI + 8);
  *(int *)(uVar1 + 0xf4) = (int)in_RDI;
  if ((uint)(*(int *)(uVar1 + 0xec) - *(int *)(uVar1 + 0xf0)) < in_ESI) {
    local_8 = lj_buf_need2((SBuf *)(uVar1 + 0xe8),in_stack_ffffffffffffffcc);
  }
  else {
    local_8 = (char *)(ulong)*(uint *)(uVar1 + 0xf0);
  }
  return local_8;
}

Assistant:

char * LJ_FASTCALL lj_buf_tmp(lua_State *L, MSize sz)
{
  SBuf *sb = &G(L)->tmpbuf;
  setsbufL(sb, L);
  return lj_buf_need(sb, sz);
}